

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_QPDFTokenizer.cc
# Opt level: O2

void __thiscall Pl_QPDFTokenizer::finish(Pl_QPDFTokenizer *this)

{
  TokenFilter *pTVar1;
  Pipeline *pPVar2;
  bool bVar3;
  Buffer *buf;
  string *context;
  char ch;
  string local_228;
  string empty;
  Token token;
  Token local_180;
  BufferInputSource input;
  
  Pl_Buffer::finish(&((this->m)._M_t.
                      super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                      .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->buf)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&token,"tokenizer data",(allocator<char> *)&local_180);
  buf = Pl_Buffer::getBuffer
                  (&((this->m)._M_t.
                     super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                     .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->buf);
  BufferInputSource::BufferInputSource(&input,(string *)&token,buf,true);
  std::__cxx11::string::~string((string *)&token);
  empty._M_dataplus._M_p = (pointer)&empty.field_2;
  empty._M_string_length = 0;
  empty.field_2._M_local_buf[0] = '\0';
  while( true ) {
    context = &empty;
    QPDFTokenizer::readToken
              (&token,&((this->m)._M_t.
                        super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                        .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->
                       tokenizer,&input.super_InputSource,context,true,0);
    (**(code **)((long)((this->m)._M_t.
                        super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                        .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->
                       filter->_vptr_TokenFilter + 0x10))();
    if (token.type == tt_eof) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"ID",(allocator<char> *)&local_228);
    bVar3 = QPDFTokenizer::Token::isWord(&token,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    if (bVar3) {
      ch = ' ';
      BufferInputSource::read(&input,(int)&ch,(void *)0x1,(size_t)context);
      pTVar1 = ((this->m)._M_t.
                super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                ._M_t.
                super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->filter;
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_228,'\x01');
      QPDFTokenizer::Token::Token(&local_180,tt_space,&local_228);
      (**(code **)((long)pTVar1->_vptr_TokenFilter + 0x10))(pTVar1,&local_180);
      QPDFTokenizer::Token::~Token(&local_180);
      std::__cxx11::string::~string((string *)&local_228);
      QPDFTokenizer::expectInlineImage
                (&((this->m)._M_t.
                   super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                   .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->
                  tokenizer,&input.super_InputSource);
    }
    QPDFTokenizer::Token::~Token(&token);
  }
  QPDFTokenizer::Token::~Token(&token);
  (**(code **)((long)((this->m)._M_t.
                      super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
                      .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->
                     filter->_vptr_TokenFilter + 0x18))();
  QPDFObjectHandle::TokenFilter::setPipeline
            (((this->m)._M_t.
              super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
              ._M_t.
              super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
              .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->filter,
             (Pipeline *)0x0);
  pPVar2 = (this->super_Pipeline).next_;
  if (pPVar2 != (Pipeline *)0x0) {
    (*pPVar2->_vptr_Pipeline[3])();
  }
  std::__cxx11::string::~string((string *)&empty);
  BufferInputSource::~BufferInputSource(&input);
  return;
}

Assistant:

void
Pl_QPDFTokenizer::finish()
{
    m->buf.finish();
    auto input = BufferInputSource("tokenizer data", m->buf.getBuffer(), true);
    std::string empty;
    while (true) {
        auto token = m->tokenizer.readToken(input, empty, true);
        m->filter->handleToken(token);
        if (token.getType() == QPDFTokenizer::tt_eof) {
            break;
        } else if (token.isWord("ID")) {
            // Read the space after the ID.
            char ch = ' ';
            input.read(&ch, 1);
            m->filter->handleToken(
                // line-break
                QPDFTokenizer::Token(QPDFTokenizer::tt_space, std::string(1, ch)));
            QTC::TC("qpdf", "Pl_QPDFTokenizer found ID");
            m->tokenizer.expectInlineImage(input);
        }
    }
    m->filter->handleEOF();
    QPDFObjectHandle::TokenFilter::PipelineAccessor::setPipeline(m->filter, nullptr);
    if (next()) {
        next()->finish();
    }
}